

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubD::RemoveEdgeVertexConnection(ON_SubD *this,ON_SubDEdge *e,ON_SubDVertex *v)

{
  bool bVar1;
  
  if (v == (ON_SubDVertex *)0x0 || e == (ON_SubDEdge *)0x0) {
    return false;
  }
  if (e->m_vertex[0] == v) {
    e->m_vertex[0] = (ON_SubDVertex *)0x0;
  }
  if (e->m_vertex[1] == v) {
    e->m_vertex[1] = (ON_SubDVertex *)0x0;
  }
  bVar1 = ON_SubDVertex::RemoveEdgeFromArray(v,e);
  return bVar1;
}

Assistant:

bool ON_SubD::RemoveEdgeVertexConnection(
  ON_SubDEdge* e,
  ON_SubDVertex* v
)
{
  if (nullptr == e || nullptr == v)
    return false;
  if (v == e->m_vertex[0])
    e->m_vertex[0] = nullptr;
  if (v == e->m_vertex[1])
    e->m_vertex[1] = nullptr;
  return v->RemoveEdgeFromArray(e);
}